

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

UString * jsonnet::internal::jsonnet_string_escape
                    (UString *__return_storage_ptr__,UString *str,bool single)

{
  ulong uVar1;
  char32_t cVar2;
  ostream *poVar3;
  char32_t *pcVar4;
  char32_t *pcVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  char32_t cVar8;
  char32_t *__s;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  UString r;
  long local_1f8;
  ulong local_1f0;
  UStringStream ss;
  stringstream ss8;
  ostream local_1a8 [376];
  
  ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
  ss.buf._M_string_length = 0;
  ss.buf.field_2._M_local_buf[0] = L'\0';
  pcVar4 = L"\'";
  bVar11 = (int)CONCAT71(in_register_00000011,single) != 0;
  if (bVar11) {
    pcVar4 = L"\\\'";
  }
  pcVar5 = L"\\\"";
  if (bVar11) {
    pcVar5 = L"\"";
  }
  uVar6 = 0;
  do {
    if (str->_M_string_length <= uVar6) {
      std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__,&ss.buf);
      std::__cxx11::u32string::~u32string((u32string *)&ss);
      return __return_storage_ptr__;
    }
    cVar8 = (str->_M_dataplus)._M_p[uVar6];
    switch(cVar8) {
    case L'\0':
      __s = L"\\u0000";
      break;
    case L'\x01':
    case L'\x02':
    case L'\x03':
    case L'\x04':
    case L'\x05':
    case L'\x06':
    case L'\a':
    case L'\v':
switchD_001702c6_caseD_1:
      if ((uint)cVar8 < 0x20 || (uint)(cVar8 + L'\xffffff81') < 0x21) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss8);
        poVar3 = std::operator<<(local_1a8,"\\u");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = std::operator<<(poVar3,0x30);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__cxx11::stringbuf::str();
        r._M_dataplus._M_p = (pointer)&r.field_2;
        r._M_string_length = 0;
        r.field_2._M_local_buf[0] = L'\0';
        for (uVar7 = 0; uVar7 < local_1f0; uVar7 = uVar7 + 1) {
          cVar2 = (char32_t)*(char *)(local_1f8 + uVar7);
          cVar8 = cVar2;
          if (*(char *)(local_1f8 + uVar7) < '\0') {
            if ((cVar2 & 0xe0U) == 0xc0) {
              uVar1 = uVar7 + 1;
              cVar8 = L'�';
              if ((uVar1 < local_1f0) &&
                 (uVar7 = uVar1, cVar8 = *(byte *)(local_1f8 + uVar1) & 0x3f | (cVar2 & 0x1fU) << 6,
                 (*(byte *)(local_1f8 + uVar1) & 0xc0) != 0x80)) {
                cVar8 = L'�';
              }
            }
            else if ((cVar2 & 0xf0U) == 0xe0) {
              uVar1 = uVar7 + 2;
              cVar8 = L'�';
              if (uVar1 < local_1f0) {
                uVar9 = (uint)*(char *)(local_1f8 + 1 + uVar7);
                if ((uVar9 & 0xc0) == 0x80) {
                  uVar7 = uVar1;
                  if ((*(byte *)(local_1f8 + uVar1) & 0xffffffc0) == 0x80) {
                    cVar8 = *(byte *)(local_1f8 + uVar1) & 0x3f |
                            (uVar9 & 0x3f) << 6 | (cVar2 & 0xfU) << 0xc;
                  }
                }
                else {
LAB_001704fd:
                  uVar7 = uVar7 + 1;
                  cVar8 = L'�';
                }
              }
            }
            else {
              cVar8 = L'�';
              if (((cVar2 & 0xf8U) == 0xf0) && (uVar1 = uVar7 + 3, uVar1 < local_1f0)) {
                uVar9 = (uint)*(char *)(local_1f8 + 1 + uVar7);
                if ((uVar9 & 0xc0) != 0x80) goto LAB_001704fd;
                uVar10 = (uint)*(char *)(local_1f8 + 2 + uVar7);
                if ((uVar10 & 0xc0) == 0x80) {
                  uVar7 = uVar1;
                  if ((*(byte *)(local_1f8 + uVar1) & 0xffffffc0) == 0x80) {
                    cVar8 = *(byte *)(local_1f8 + uVar1) & 0x3f |
                            (uVar10 & 0x3f) << 6 | (uVar9 & 0x3f) << 0xc | (cVar2 & 7U) << 0x12;
                  }
                }
                else {
                  uVar7 = uVar7 + 2;
                }
              }
            }
          }
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (&r,cVar8);
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,&r);
        std::__cxx11::u32string::~u32string((u32string *)&r);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss8);
      }
      else {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(&ss.buf,cVar8);
      }
      goto LAB_00170552;
    case L'\b':
      __s = L"\\b";
      break;
    case L'\t':
      __s = L"\\t";
      break;
    case L'\n':
      __s = L"\\n";
      break;
    case L'\f':
      __s = L"\\f";
      break;
    case L'\r':
      __s = L"\\r";
      break;
    default:
      if (cVar8 == L'\\') {
        __s = L"\\\\";
      }
      else {
        __s = pcVar4;
        if ((cVar8 != L'\'') && (__s = pcVar5, cVar8 != L'\"')) goto switchD_001702c6_caseD_1;
      }
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&ss.buf,__s);
LAB_00170552:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

UString jsonnet_string_escape(const UString &str, bool single)
{
    UStringStream ss;
    for (std::size_t i = 0; i < str.length(); ++i) {
        char32_t c = str[i];
        switch (c) {
            case U'\"': ss << (single ? U"\"" : U"\\\""); break;
            case U'\'': ss << (single ? U"\\\'" : U"\'"); break;
            case U'\\': ss << U"\\\\"; break;
            case U'\b': ss << U"\\b"; break;
            case U'\f': ss << U"\\f"; break;
            case U'\n': ss << U"\\n"; break;
            case U'\r': ss << U"\\r"; break;
            case U'\t': ss << U"\\t"; break;
            case U'\0': ss << U"\\u0000"; break;
            default: {
                if (c < 0x20 || (c >= 0x7f && c <= 0x9f)) {
                    // Unprintable, use \u
                    std::stringstream ss8;
                    ss8 << "\\u" << std::hex << std::setfill('0') << std::setw(4)
                        << (unsigned long)(c);
                    ss << decode_utf8(ss8.str());
                } else {
                    // Printable, write verbatim
                    ss << c;
                }
            }
        }
    }
    return ss.str();
}